

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>
          (MessageCreator *this,MessageLite *prototype_for_func,MessageLite *prototype_for_copy,
          void *mem,Arena *arena)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Tag TVar4;
  uint uVar5;
  intptr_t iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  MessageLite *pMVar14;
  long lVar15;
  ulong uVar16;
  MessageLite *pMVar17;
  MessageLite *pMVar18;
  ulong uVar19;
  Arena *unaff_RBX;
  ulong uVar20;
  MessageCreator *unaff_R13;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  MessageLite MStack_58;
  MessageLite local_40;
  
  if ((ulong)mem % (ulong)this->alignment_ == 0) {
    TVar4 = this->tag_;
    if (TVar4 < kZeroInit) goto LAB_0015ccdb;
    uVar5 = this->allocation_size_;
    uVar20 = (ulong)uVar5;
    if (TVar4 == kZeroInit) {
      pMVar18 = (MessageLite *)((long)&prototype_for_copy->_vptr_MessageLite + uVar20);
      MStack_58._internal_metadata_.ptr_ = 0x15cb24;
      pMVar17 = pMVar18;
      pMVar14 = (MessageLite *)
                std::
                __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>(google::protobuf::MessageLite_const*,google::protobuf::MessageLite_const*,void*,google::protobuf::Arena*)const::_lambda(auto:1)_1_>>
                          (prototype_for_copy + 1);
      if (pMVar14 != pMVar18) {
LAB_0015cd02:
        pMVar18 = &local_40;
        MStack_58._internal_metadata_.ptr_ = (intptr_t)arena_bits;
        PlacementNew<false,google::protobuf::MessageLite>();
        if (*(char *)((long)&pMVar18->_vptr_MessageLite + 4) != -1) {
          return (MessageLite *)(pMVar18->_internal_metadata_).ptr_;
        }
        pMVar18 = &MStack_58;
        arena_bits();
        lVar15 = (long)pMVar17 - (long)pMVar18 >> 2;
        pMVar14 = pMVar18;
        if (0 < lVar15) {
          pMVar14 = (MessageLite *)
                    ((long)&pMVar18->_vptr_MessageLite +
                    ((long)pMVar17 - (long)pMVar18 & 0xfffffffffffffffcU));
          lVar15 = lVar15 + 1;
          pMVar18 = (MessageLite *)((long)&pMVar18->_vptr_MessageLite + 3);
          do {
            if (*(char *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 5) != '\0') {
              return (MessageLite *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 5);
            }
            if (*(char *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 6) != '\0') {
              return (MessageLite *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 6);
            }
            if (*(char *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 7) != '\0') {
              return (MessageLite *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 7);
            }
            if (*(char *)&pMVar18->_vptr_MessageLite != '\0') {
              return pMVar18;
            }
            lVar15 = lVar15 + -1;
            pMVar18 = (MessageLite *)((long)&pMVar18->_vptr_MessageLite + 4);
          } while (1 < lVar15);
        }
        lVar15 = (long)pMVar17 - (long)pMVar14;
        if (lVar15 != 1) {
          if (lVar15 != 2) {
            if (lVar15 != 3) {
              return pMVar17;
            }
            if (*(char *)&pMVar14->_vptr_MessageLite != '\0') {
              return pMVar14;
            }
            pMVar14 = (MessageLite *)((long)&pMVar14->_vptr_MessageLite + 1);
          }
          if (*(char *)&pMVar14->_vptr_MessageLite != '\0') {
            return pMVar14;
          }
          pMVar14 = (MessageLite *)((long)&pMVar14->_vptr_MessageLite + 1);
        }
        if (*(char *)&pMVar14->_vptr_MessageLite != '\0') {
          return pMVar14;
        }
        return pMVar17;
      }
      if (uVar5 < 0x21) {
        uVar21 = 0;
        uVar22 = 0;
        uVar23 = 0;
        uVar24 = 0;
LAB_0015cb4d:
        puVar1 = (undefined4 *)((long)mem + (uVar20 - 0x10));
        *puVar1 = uVar21;
        puVar1[1] = uVar22;
        puVar1[2] = uVar23;
        puVar1[3] = uVar24;
      }
      else {
        if (uVar5 < 0x41) {
          uVar21 = 0;
          uVar22 = 0;
          uVar23 = 0;
          uVar24 = 0;
          *(undefined8 *)((long)mem + 0x10) = 0;
          *(undefined8 *)((long)mem + 0x18) = 0;
          puVar2 = (undefined8 *)((long)mem + (uVar20 - 0x10));
          *puVar2 = 0;
          puVar2[1] = 0;
          goto LAB_0015cb90;
        }
        if (0x50 < uVar5) {
          lVar15 = (long)mem + 0x50;
          uVar16 = 0x50;
          do {
            *(undefined8 *)(lVar15 + -0x10) = 0;
            *(undefined8 *)(lVar15 + -8) = 0;
            *(undefined8 *)(lVar15 + -0x20) = 0;
            *(undefined8 *)(lVar15 + -0x18) = 0;
            *(undefined8 *)(lVar15 + -0x30) = 0;
            *(undefined8 *)(lVar15 + -0x28) = 0;
            *(undefined8 *)(lVar15 + -0x40) = 0;
            *(undefined8 *)(lVar15 + -0x38) = 0;
            uVar16 = uVar16 + 0x40;
            lVar15 = lVar15 + 0x40;
          } while (uVar16 < uVar20);
        }
        uVar21 = 0;
        uVar22 = 0;
        uVar23 = 0;
        uVar24 = 0;
        puVar2 = (undefined8 *)((long)mem + (uVar20 - 0x10));
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)mem + (uVar20 - 0x20));
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)mem + (uVar20 - 0x30));
        *puVar2 = 0;
        puVar2[1] = 0;
LAB_0015cc5a:
        puVar1 = (undefined4 *)((long)mem + (uVar20 - 0x40));
        *puVar1 = uVar21;
        puVar1[1] = uVar22;
        puVar1[2] = uVar23;
        puVar1[3] = uVar24;
      }
    }
    else {
      if (TVar4 != kMemcpy) {
        pMVar17 = &local_40;
        MStack_58._internal_metadata_.ptr_ = 0x15cd02;
        PlacementNew<false,google::protobuf::MessageLite>();
        goto LAB_0015cd02;
      }
      if (uVar5 < 0x21) {
        puVar1 = (undefined4 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar20);
        uVar21 = *puVar1;
        uVar22 = puVar1[1];
        uVar23 = puVar1[2];
        uVar24 = puVar1[3];
        goto LAB_0015cb4d;
      }
      if (0x40 < uVar5) {
        if (0x50 < uVar5) {
          lVar15 = (long)mem + 0x50;
          uVar16 = 0x50;
          do {
            puVar2 = (undefined8 *)((long)&prototype_for_copy[-4]._vptr_MessageLite + uVar16);
            uVar7 = *puVar2;
            uVar8 = puVar2[1];
            puVar2 = (undefined8 *)((long)&prototype_for_copy[-3]._vptr_MessageLite + uVar16);
            uVar9 = *puVar2;
            uVar10 = puVar2[1];
            puVar2 = (undefined8 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar16);
            uVar11 = *puVar2;
            uVar12 = puVar2[1];
            puVar2 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar16);
            uVar13 = puVar2[1];
            *(undefined8 *)(lVar15 + -0x10) = *puVar2;
            *(undefined8 *)(lVar15 + -8) = uVar13;
            *(undefined8 *)(lVar15 + -0x20) = uVar11;
            *(undefined8 *)(lVar15 + -0x18) = uVar12;
            *(undefined8 *)(lVar15 + -0x30) = uVar9;
            *(undefined8 *)(lVar15 + -0x28) = uVar10;
            *(undefined8 *)(lVar15 + -0x40) = uVar7;
            *(undefined8 *)(lVar15 + -0x38) = uVar8;
            uVar16 = uVar16 + 0x40;
            lVar15 = lVar15 + 0x40;
          } while (uVar16 < uVar20);
        }
        puVar1 = (undefined4 *)((long)&prototype_for_copy[-4]._vptr_MessageLite + uVar20);
        uVar21 = *puVar1;
        uVar22 = puVar1[1];
        uVar23 = puVar1[2];
        uVar24 = puVar1[3];
        puVar2 = (undefined8 *)((long)&prototype_for_copy[-3]._vptr_MessageLite + uVar20);
        uVar7 = *puVar2;
        uVar8 = puVar2[1];
        puVar2 = (undefined8 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar20);
        uVar9 = *puVar2;
        uVar10 = puVar2[1];
        puVar2 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar20);
        uVar11 = puVar2[1];
        puVar3 = (undefined8 *)((long)mem + (uVar20 - 0x10));
        *puVar3 = *puVar2;
        puVar3[1] = uVar11;
        puVar2 = (undefined8 *)((long)mem + (uVar20 - 0x20));
        *puVar2 = uVar9;
        puVar2[1] = uVar10;
        puVar2 = (undefined8 *)((long)mem + (uVar20 - 0x30));
        *puVar2 = uVar7;
        puVar2[1] = uVar8;
        goto LAB_0015cc5a;
      }
      iVar6 = prototype_for_copy[1]._internal_metadata_.ptr_;
      *(_func_int ***)((long)mem + 0x10) = prototype_for_copy[1]._vptr_MessageLite;
      *(intptr_t *)((long)mem + 0x18) = iVar6;
      puVar1 = (undefined4 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar20);
      uVar21 = *puVar1;
      uVar22 = puVar1[1];
      uVar23 = puVar1[2];
      uVar24 = puVar1[3];
      puVar2 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar20);
      uVar7 = puVar2[1];
      puVar3 = (undefined8 *)((long)mem + (uVar20 - 0x10));
      *puVar3 = *puVar2;
      puVar3[1] = uVar7;
LAB_0015cb90:
      puVar1 = (undefined4 *)((long)mem + (uVar20 - 0x20));
      *puVar1 = uVar21;
      puVar1[1] = uVar22;
      puVar1[2] = uVar23;
      puVar1[3] = uVar24;
    }
    MStack_58._internal_metadata_.ptr_ = 0x15cc68;
    arena_bits(this);
    MStack_58._internal_metadata_.ptr_ = 0x15cc70;
    uVar16 = arena_bits(this);
    while( true ) {
      if (uVar16 == 0) {
        *(_func_int ***)mem = prototype_for_copy->_vptr_MessageLite;
        *(Arena **)((long)mem + 8) = arena;
        return (MessageLite *)mem;
      }
      lVar15 = 0;
      if (uVar16 != 0) {
        for (; (uVar16 >> lVar15 & 1) == 0; lVar15 = lVar15 + 1) {
        }
      }
      uVar19 = (ulong)(uint)((int)lVar15 << 3);
      if (uVar20 < uVar19 + 8) break;
      if (*(long *)((long)mem + uVar19) != 0) goto LAB_0015ccc4;
      *(Arena **)((long)mem + uVar19) = arena;
      uVar16 = uVar16 & uVar16 - 1;
    }
    MStack_58._internal_metadata_.ptr_ = 0x15ccc4;
    PlacementNew<false,google::protobuf::MessageLite>();
LAB_0015ccc4:
    MStack_58._internal_metadata_.ptr_ = 0x15ccce;
    PlacementNew<false,google::protobuf::MessageLite>();
    unaff_RBX = arena;
    unaff_R13 = this;
  }
  this = unaff_R13;
  arena = unaff_RBX;
  prototype_for_func = &local_40;
  MStack_58._internal_metadata_.ptr_ = 0x15ccdb;
  PlacementNew<false,google::protobuf::MessageLite>();
LAB_0015ccdb:
  pMVar17 = (MessageLite *)(*(this->field_3).func_)(prototype_for_func,mem,arena);
  return pMVar17;
}

Assistant:

PROTOBUF_ALWAYS_INLINE inline MessageLite* MessageCreator::PlacementNew(
    const MessageLite* prototype_for_func,
    const MessageLite* prototype_for_copy, void* mem, Arena* arena) const {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) % alignment_, 0u);
  const Tag as_tag = tag();
  // When the feature is not enabled we skip the `as_tag` check since it is
  // unnecessary. Except for testing, where we want to test the copy logic even
  // when we can't use it for real messages.
  constexpr bool kMustBeFunc = !test_call && !internal::EnableCustomNew();
  static_assert(kFunc < 0 && !(kZeroInit < 0) && !(kMemcpy < 0),
                "Only kFunc must be the only negative value");
  if (ABSL_PREDICT_FALSE(kMustBeFunc || as_tag < 0)) {
    PROTOBUF_DEBUG_COUNTER("MessageCreator.Func").Inc();
    return static_cast<MessageLite*>(func_(prototype_for_func, mem, arena));
  }

  char* dst = static_cast<char*>(mem);
  const size_t size = allocation_size_;
  const char* src = reinterpret_cast<const char*>(prototype_for_copy);

  // These are a bit more efficient than calling normal memset/memcpy because:
  //  - We know the minimum size is 16. We have a fallback for when it is not.
  //  - We can "underflow" the buffer because those are the MessageLite bytes
  //    we will set later.
#ifndef PROTO2_OPENSOURCE
  // This manual handling shows a 1.85% improvement in the parsing
  // microbenchmark.
  // TODO: Verify this is still the case.
#endif  // !PROTO2_OPENSOUCE
  if (as_tag == kZeroInit) {
    // Make sure the input is really all zeros.
    ABSL_DCHECK(std::all_of(src + sizeof(MessageLite), src + size,
                            [](auto c) { return c == 0; }));

    if (sizeof(MessageLite) != 16) {
      memset(dst, 0, size);
    } else if (size <= 32) {
      memset(dst + size - 16, 0, 16);
    } else if (size <= 64) {
      memset(dst + 16, 0, 16);
      memset(dst + size - 32, 0, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memset(dst + offset, 0, 64);
      }
      memset(dst + size - 64, 0, 64);
    }
  } else {
    ABSL_DCHECK_EQ(+as_tag, +kMemcpy);

    if (sizeof(MessageLite) != 16) {
      memcpy(dst, src, size);
    } else if (size <= 32) {
      memcpy(dst + size - 16, src + size - 16, 16);
    } else if (size <= 64) {
      memcpy(dst + 16, src + 16, 16);
      memcpy(dst + size - 32, src + size - 32, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCache(src + offset + 64);
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memcpy(dst + offset, src + offset, 64);
      }
      memcpy(dst + size - 64, src + size - 64, 64);
    }
  }

  if (arena_bits() != 0) {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.ZeroArena").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.McpyArena").Inc();
    }
  } else {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Zero").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Mcpy").Inc();
    }
  }

  if (internal::PerformDebugChecks() || arena != nullptr) {
    if (uintptr_t offsets = arena_bits()) {
      do {
        const size_t offset = absl::countr_zero(offsets) * sizeof(Arena*);
        ABSL_DCHECK_LE(offset + sizeof(Arena*), size);
        // Verify we are overwriting a null pointer. If we are not, there is a
        // bug somewhere.
        ABSL_DCHECK_EQ(*reinterpret_cast<Arena**>(dst + offset), nullptr);
        memcpy(dst + offset, &arena, sizeof(arena));
        offsets &= offsets - 1;
      } while (offsets != 0);
    }
  }

  // The second memcpy overwrites part of the first, but the compiler should
  // avoid the double-write. It's easier than trying to avoid the overlap.
  memcpy(dst, static_cast<const void*>(prototype_for_copy),
         sizeof(MessageLite));
  memcpy(dst + PROTOBUF_FIELD_OFFSET(MessageLite, _internal_metadata_), &arena,
         sizeof(arena));
  return Launder(reinterpret_cast<MessageLite*>(mem));
}